

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

int32 hash_table_lookup_int32(hash_table_t *h,char *key,int32 *val)

{
  int32 iVar1;
  void *vval;
  
  iVar1 = hash_table_lookup(h,key,&vval);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (val != (int32 *)0x0) {
      *val = (int32)vval;
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int32
hash_table_lookup_int32(hash_table_t * h, const char *key, int32 *val)
{
    void *vval;
    int32 rv;

    rv = hash_table_lookup(h, key, &vval);
    if (rv != 0)
        return rv;
    if (val)
        *val = (int32)(size_t)vval;
    return 0;
}